

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_compute_table_impl.h
# Opt level: O0

void secp256k1_ecmult_compute_table(secp256k1_ge_storage *table,int window_g,secp256k1_gej *gen)

{
  void *in_RDX;
  undefined4 in_ESI;
  int j;
  secp256k1_ge dgen;
  secp256k1_ge ge;
  secp256k1_gej gj;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar1;
  secp256k1_gej *in_stack_fffffffffffffe80;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  undefined1 local_b0 [164];
  undefined4 local_c;
  
  local_c = in_ESI;
  memcpy(local_b0,in_RDX,0x98);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  secp256k1_ge_to_storage
            ((secp256k1_ge_storage *)in_stack_fffffffffffffee0,
             (secp256k1_ge *)in_stack_fffffffffffffed8);
  secp256k1_gej_double_var
            (in_stack_fffffffffffffe80,
             (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (secp256k1_fe *)0x1255d5);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  for (iVar1 = 1; (long)iVar1 < 1L << ((char)local_c - 2U & 0x3f); iVar1 = iVar1 + 1) {
    secp256k1_gej_set_ge
              (in_stack_fffffffffffffe80,(secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffe78));
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)ge.x.n[0],(secp256k1_gej *)dgen._96_8_,(secp256k1_ge *)dgen.y._40_8_
               ,(secp256k1_fe *)dgen.y.n[4]);
    secp256k1_ge_set_gej_var(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    secp256k1_ge_to_storage
              ((secp256k1_ge_storage *)in_stack_fffffffffffffee0,
               (secp256k1_ge *)in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_compute_table(secp256k1_ge_storage* table, int window_g, const secp256k1_gej* gen) {
    secp256k1_gej gj;
    secp256k1_ge ge, dgen;
    int j;

    gj = *gen;
    secp256k1_ge_set_gej_var(&ge, &gj);
    secp256k1_ge_to_storage(&table[0], &ge);

    secp256k1_gej_double_var(&gj, gen, NULL);
    secp256k1_ge_set_gej_var(&dgen, &gj);

    for (j = 1; j < ECMULT_TABLE_SIZE(window_g); ++j) {
        secp256k1_gej_set_ge(&gj, &ge);
        secp256k1_gej_add_ge_var(&gj, &gj, &dgen, NULL);
        secp256k1_ge_set_gej_var(&ge, &gj);
        secp256k1_ge_to_storage(&table[j], &ge);
    }
}